

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *this_00;
  float _v;
  int iVar1;
  float local_6c;
  Mat local_68;
  
  (**mb->_vptr_ModelBin)(&local_68,mb,(ulong)(uint)this->weight_data_size,0);
  Mat::operator=(&this->weight_data,&local_68);
  Mat::~Mat(&local_68);
  iVar1 = -100;
  if (((this->weight_data).data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&local_68,mb,(ulong)(uint)this->num_output,1);
      Mat::operator=(&this->bias_data,&local_68);
      Mat::~Mat(&local_68);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term == 2) {
      (**mb->_vptr_ModelBin)(&local_68,mb,1);
      this_00 = &this->weight_data_int8_scales;
      Mat::operator=(this_00,&local_68);
      Mat::~Mat(&local_68);
      (**mb->_vptr_ModelBin)(&local_68,mb,1);
      Mat::operator=(&this->bottom_blob_int8_scales,&local_68);
      Mat::~Mat(&local_68);
      _v = *(this->weight_data_int8_scales).data;
      Mat::Mat(&local_68,this->group,4,(Allocator *)0x0);
      Mat::operator=(this_00,&local_68);
      Mat::~Mat(&local_68);
      Mat::fill(this_00,_v);
      local_6c = *(this->bottom_blob_int8_scales).data;
      Mat::Mat(&local_68,this->group,4,(Allocator *)0x0);
      Mat::operator=(&this->bottom_blob_int8_scales,&local_68);
    }
    else {
      if (this->int8_scale_term != 1) {
        return 0;
      }
      (**mb->_vptr_ModelBin)(&local_68,mb,(ulong)(uint)this->group,1);
      Mat::operator=(&this->weight_data_int8_scales,&local_68);
      Mat::~Mat(&local_68);
      (**mb->_vptr_ModelBin)(&local_68,mb,1);
      Mat::operator=(&this->bottom_blob_int8_scales,&local_68);
      Mat::~Mat(&local_68);
      local_6c = *(this->bottom_blob_int8_scales).data;
      Mat::Mat(&local_68,this->group,4,(Allocator *)0x0);
      Mat::operator=(&this->bottom_blob_int8_scales,&local_68);
    }
    iVar1 = 0;
    Mat::~Mat(&local_68);
    Mat::fill(&this->bottom_blob_int8_scales,local_6c);
  }
  return iVar1;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    return 0;
}